

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_inst.h
# Opt level: O0

void __thiscall mocker::ir::Malloc::~Malloc(Malloc *this)

{
  Malloc *this_local;
  
  (this->super_IRInst)._vptr_IRInst = (_func_int **)&PTR__Malloc_0039c610;
  (this->super_Definition)._vptr_Definition = (_func_int **)&PTR__Malloc_0039c630;
  std::shared_ptr<mocker::ir::Addr>::~shared_ptr(&this->size);
  Definition::~Definition(&this->super_Definition);
  IRInst::~IRInst(&this->super_IRInst);
  return;
}

Assistant:

Malloc(std::shared_ptr<Reg> dest, std::shared_ptr<Addr> size)
      : IRInst(InstType::Malloc), Definition(std::move(dest)),
        size(std::move(size)) {}